

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

InputType __thiscall Assimp::ColladaParser::GetTypeForSemantic(ColladaParser *this,string *semantic)

{
  bool bVar1;
  ulong uVar2;
  Logger *pLVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_00;
  basic_formatter *this_01;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *semantic_local;
  ColladaParser *this_local;
  
  local_20 = semantic;
  semantic_local = &this->mFileName;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = std::operator==(local_20,"POSITION");
    if (bVar1) {
      this_local._4_4_ = IT_Position;
    }
    else {
      bVar1 = std::operator==(local_20,"TEXCOORD");
      if (bVar1) {
        this_local._4_4_ = IT_Texcoord;
      }
      else {
        bVar1 = std::operator==(local_20,"NORMAL");
        if (bVar1) {
          this_local._4_4_ = IT_Normal;
        }
        else {
          bVar1 = std::operator==(local_20,"COLOR");
          if (bVar1) {
            this_local._4_4_ = IT_Color;
          }
          else {
            bVar1 = std::operator==(local_20,"VERTEX");
            if (bVar1) {
              this_local._4_4_ = IT_Vertex;
            }
            else {
              bVar1 = std::operator==(local_20,"BINORMAL");
              if ((!bVar1) && (bVar1 = std::operator==(local_20,"TEXBINORMAL"), !bVar1)) {
                bVar1 = std::operator==(local_20,"TANGENT");
                if ((!bVar1) && (bVar1 = std::operator==(local_20,"TEXTANGENT"), !bVar1)) {
                  pLVar3 = DefaultLogger::get();
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  basic_formatter<char[28]>
                            (&local_1b8,(char (*) [28])"Unknown vertex input type \"");
                  this_00 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            Formatter::
                            basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                            operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                       *)&local_1b8,local_20);
                  this_01 = (basic_formatter *)
                            Formatter::
                            basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                            operator_(this_00,(char (*) [13])"\". Ignoring.");
                  Formatter::basic_formatter::operator_cast_to_string(&local_40,this_01);
                  Logger::warn(pLVar3,&local_40);
                  std::__cxx11::string::~string((string *)&local_40);
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  ~basic_formatter(&local_1b8);
                  return IT_Invalid;
                }
                return IT_Tangent;
              }
              this_local._4_4_ = IT_Bitangent;
            }
          }
        }
      }
    }
  }
  else {
    pLVar3 = DefaultLogger::get();
    Logger::warn(pLVar3,"Vertex input type is empty.");
    this_local._4_4_ = IT_Invalid;
  }
  return this_local._4_4_;
}

Assistant:

Collada::InputType ColladaParser::GetTypeForSemantic(const std::string& semantic)
{
    if (semantic.empty()) {
        ASSIMP_LOG_WARN("Vertex input type is empty.");
        return IT_Invalid;
    }

    if (semantic == "POSITION")
        return IT_Position;
    else if (semantic == "TEXCOORD")
        return IT_Texcoord;
    else if (semantic == "NORMAL")
        return IT_Normal;
    else if (semantic == "COLOR")
        return IT_Color;
    else if (semantic == "VERTEX")
        return IT_Vertex;
    else if (semantic == "BINORMAL" || semantic == "TEXBINORMAL")
        return IT_Bitangent;
    else if (semantic == "TANGENT" || semantic == "TEXTANGENT")
        return IT_Tangent;

    ASSIMP_LOG_WARN_F("Unknown vertex input type \"", semantic, "\". Ignoring.");
    return IT_Invalid;
}